

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# information_flow.c
# Opt level: O1

double inform_information_flow
                 (int *src,int *dst,int *back,size_t l_src,size_t l_dst,size_t l_back,size_t n,
                 size_t m,int b,inform_error *err)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  _Bool _Var6;
  int *piVar7;
  void *__ptr;
  inform_error iVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  int *piVar13;
  int *piVar14;
  size_t sVar15;
  ulong uVar16;
  int b_state;
  int iVar17;
  size_t n_00;
  ulong uVar18;
  size_t sVar19;
  int *piVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  int local_88;
  int local_78;
  long local_70;
  int local_68;
  int local_38;
  int local_34;
  
  if (((src == (int *)0x0 || l_src == 0) || (dst == (int *)0x0 || l_dst == 0)) ||
     (l_back != 0 && back == (int *)0x0)) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
  }
  else if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOINITS;
    }
  }
  else if (m == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
    }
  }
  else if (b < 2) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBASE;
    }
  }
  else {
    n_00 = m * n;
    uVar9 = n_00 * l_src;
    bVar29 = uVar9 != 0;
    if (bVar29) {
      uVar18 = 1;
      do {
        if (b <= src[uVar18 - 1]) {
          iVar8 = INFORM_EBADSTATE;
LAB_00158dd6:
          if (err != (inform_error *)0x0) {
            *err = iVar8;
          }
          if (bVar29) {
            return NAN;
          }
          break;
        }
        if (src[uVar18 - 1] < 0) {
          iVar8 = INFORM_ENEGSTATE;
          goto LAB_00158dd6;
        }
        bVar29 = uVar18 < uVar9;
        bVar30 = uVar18 != uVar9;
        uVar18 = uVar18 + 1;
      } while (bVar30);
    }
    uVar9 = n_00 * l_dst;
    bVar29 = uVar9 != 0;
    if (bVar29) {
      uVar18 = 1;
      do {
        if (b <= dst[uVar18 - 1]) {
          iVar8 = INFORM_EBADSTATE;
LAB_00158e34:
          if (err != (inform_error *)0x0) {
            *err = iVar8;
          }
          if (bVar29) {
            return NAN;
          }
          break;
        }
        if (dst[uVar18 - 1] < 0) {
          iVar8 = INFORM_ENEGSTATE;
          goto LAB_00158e34;
        }
        bVar29 = uVar18 < uVar9;
        bVar30 = uVar18 != uVar9;
        uVar18 = uVar18 + 1;
      } while (bVar30);
    }
    if (back != (int *)0x0) {
      uVar9 = n_00 * l_back;
      bVar29 = uVar9 != 0;
      if (bVar29) {
        uVar18 = 1;
        do {
          if (b <= back[uVar18 - 1]) {
            iVar8 = INFORM_EBADSTATE;
LAB_00158e93:
            if (err != (inform_error *)0x0) {
              *err = iVar8;
            }
            if (bVar29) {
              return NAN;
            }
            break;
          }
          if (back[uVar18 - 1] < 0) {
            iVar8 = INFORM_ENEGSTATE;
            goto LAB_00158e93;
          }
          bVar29 = uVar18 < uVar9;
          bVar30 = uVar18 != uVar9;
          uVar18 = uVar18 + 1;
        } while (bVar30);
      }
    }
    if (back == (int *)0x0 || l_back == 0) {
      lVar25 = n_00 * 2 + l_src;
      piVar7 = (int *)malloc((lVar25 + l_dst) * 4);
      if (piVar7 != (int *)0x0) {
        iVar12 = 1;
        iVar22 = 1;
        if (l_src != 0) {
          sVar10 = 0;
          do {
            iVar22 = iVar22 * b;
            piVar7[n_00 * 2 + sVar10] = b;
            sVar10 = sVar10 + 1;
          } while (l_src != sVar10);
        }
        if (l_dst != 0) {
          iVar12 = 1;
          sVar10 = 0;
          do {
            iVar12 = iVar12 * b;
            piVar7[lVar25 + sVar10] = b;
            sVar10 = sVar10 + 1;
          } while (l_dst != sVar10);
        }
        inform_black_box(src,l_src,n,m,piVar7 + n_00 * 2,(size_t *)0x0,(size_t *)0x0,piVar7,err);
        _Var6 = inform_failed(err);
        if (!_Var6) {
          inform_black_box(dst,l_dst,n,m,piVar7 + n_00 * 2 + l_src,(size_t *)0x0,(size_t *)0x0,
                           piVar7 + n_00,err);
          _Var6 = inform_failed(err);
          if (!_Var6) {
            local_38 = iVar22;
            local_34 = iVar12;
            dVar31 = inform_mutual_info(piVar7,2,n_00,&local_38,err);
            free(piVar7);
            return dVar31;
          }
          return NAN;
        }
        return NAN;
      }
    }
    else {
      dVar31 = (double)b;
      auVar37._8_4_ = (int)(l_src >> 0x20);
      auVar37._0_8_ = l_src;
      auVar37._12_4_ = 0x45300000;
      dVar32 = pow(dVar31,(auVar37._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)l_src) - 4503599627370496.0));
      uVar23 = (long)(dVar32 - 9.223372036854776e+18) & (long)dVar32 >> 0x3f | (long)dVar32;
      auVar33._8_4_ = (int)(l_dst >> 0x20);
      auVar33._0_8_ = l_dst;
      auVar33._12_4_ = 0x45300000;
      dVar32 = pow(dVar31,(auVar33._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)l_dst) - 4503599627370496.0));
      uVar18 = (long)(dVar32 - 9.223372036854776e+18) & (long)dVar32 >> 0x3f | (long)dVar32;
      auVar34._8_4_ = (int)(l_back >> 0x20);
      auVar34._0_8_ = l_back;
      auVar34._12_4_ = 0x45300000;
      dVar31 = pow(dVar31,(auVar34._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)l_back) - 4503599627370496.0));
      uVar9 = (long)(dVar31 - 9.223372036854776e+18) & (long)dVar31 >> 0x3f | (long)dVar31;
      lVar26 = uVar9 * uVar23;
      lVar24 = lVar26 * uVar18;
      lVar25 = uVar9 * uVar18;
      __ptr = calloc(lVar26 + uVar9 + lVar25 + lVar24,4);
      if (__ptr != (void *)0x0) {
        lVar26 = lVar26 * 4 + lVar24 * 4;
        lVar5 = lVar25 * 4 + lVar26;
        sVar10 = 0;
        do {
          sVar15 = 0;
          piVar7 = back;
          piVar13 = dst;
          piVar14 = src;
          do {
            iVar12 = 0;
            iVar22 = 0;
            if (l_src != 0) {
              iVar22 = 0;
              sVar19 = l_src;
              piVar20 = piVar14;
              do {
                iVar22 = iVar22 * b + *piVar20;
                piVar20 = piVar20 + n_00;
                sVar19 = sVar19 - 1;
              } while (sVar19 != 0);
            }
            if (l_dst != 0) {
              iVar12 = 0;
              sVar19 = l_dst;
              piVar20 = piVar13;
              do {
                iVar12 = iVar12 * b + *piVar20;
                piVar20 = piVar20 + n_00;
                sVar19 = sVar19 - 1;
              } while (sVar19 != 0);
            }
            lVar27 = 0;
            piVar20 = piVar7;
            sVar19 = l_back;
            do {
              lVar27 = (long)((int)lVar27 * b) + (long)*piVar20;
              piVar20 = piVar20 + n_00;
              sVar19 = sVar19 - 1;
            } while (sVar19 != 0);
            iVar17 = (int)uVar9;
            iVar12 = iVar12 * iVar17 + (int)lVar27;
            local_88 = (int)lVar25;
            piVar20 = (int *)((long)__ptr + (long)(iVar22 * local_88 + iVar12) * 4);
            *piVar20 = *piVar20 + 1;
            piVar20 = (int *)((long)__ptr + (long)(iVar22 * iVar17 + (int)lVar27) * 4 + lVar24 * 4);
            *piVar20 = *piVar20 + 1;
            piVar20 = (int *)((long)__ptr + (long)iVar12 * 4 + lVar26);
            *piVar20 = *piVar20 + 1;
            piVar20 = (int *)((long)__ptr + lVar27 * 4 + lVar5);
            *piVar20 = *piVar20 + 1;
            sVar15 = sVar15 + 1;
            piVar14 = piVar14 + 1;
            piVar13 = piVar13 + 1;
            piVar7 = piVar7 + 1;
          } while (sVar15 != m);
          sVar10 = sVar10 + 1;
          src = src + m;
          dst = dst + m;
          back = back + m;
        } while (sVar10 != n);
        if (iVar17 < 1) {
          dVar31 = 0.0;
        }
        else {
          dVar31 = 0.0;
          local_70 = 0;
          uVar16 = 0;
          do {
            local_78 = (int)uVar18;
            uVar1 = *(uint *)((long)__ptr + uVar16 * 4 + lVar5);
            if (uVar1 != 0 && 0 < local_78) {
              uVar11 = uVar16 & 0xffffffff;
              uVar21 = 0;
              do {
                local_68 = (int)uVar23;
                uVar2 = *(uint *)((long)__ptr +
                                 (long)((int)uVar21 * iVar17 + (int)uVar16) * 4 + lVar26);
                iVar12 = (int)uVar11;
                if (uVar2 != 0 && 0 < local_68) {
                  lVar25 = local_70;
                  uVar28 = uVar23 & 0x7fffffff;
                  do {
                    uVar3 = *(uint *)((long)__ptr + (lVar25 >> 0x1e) + lVar24 * 4);
                    if ((uVar3 != 0) &&
                       (uVar4 = *(uint *)((long)__ptr + (long)(int)uVar11 * 4), uVar4 != 0)) {
                      dVar36 = (double)uVar4;
                      dVar32 = log2(((double)uVar1 * dVar36) / ((double)uVar3 * (double)uVar2));
                      dVar31 = dVar31 + dVar32 * dVar36;
                    }
                    lVar25 = lVar25 + (uVar9 << 0x20);
                    uVar11 = (ulong)(uint)((int)uVar11 + local_88);
                    uVar28 = uVar28 - 1;
                  } while (uVar28 != 0);
                }
                uVar21 = uVar21 + 1;
                uVar11 = (ulong)(uint)(iVar12 + iVar17);
              } while (uVar21 != (uVar18 & 0x7fffffff));
            }
            uVar16 = uVar16 + 1;
            local_70 = local_70 + 0x100000000;
          } while (uVar16 != (uVar9 & 0x7fffffff));
        }
        free(__ptr);
        auVar35._0_8_ = (double)CONCAT44(0x43300000,(int)n_00);
        auVar35._8_4_ = (int)(n_00 >> 0x20);
        auVar35._12_4_ = 0x45300000;
        return dVar31 / ((auVar35._8_8_ - 1.9342813113834067e+25) +
                        (auVar35._0_8_ - 4503599627370496.0));
      }
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  return NAN;
}

Assistant:

double inform_information_flow(int const *src, int const *dst, int const *back,
    size_t l_src, size_t l_dst, size_t l_back, size_t n, size_t m, int b,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l_src, l_dst, l_back, n, m, b, err))
    {
        return NAN;
    }

    if (back == NULL || l_back == 0)
    {
        return mutual_info(src, dst, l_src, l_dst, n, m, b, err);
    }

    size_t const N = n * m;

    size_t const a_size = pow((double) b, (double) l_src);
    size_t const b_size = pow((double) b, (double) l_dst);
    size_t const s_size = pow((double) b, (double) l_back);

    size_t const joint_size = a_size * b_size * s_size;
    size_t const as_size = a_size * s_size;
    size_t const bs_size = b_size * s_size;

    size_t const total_size = joint_size + as_size + bs_size + s_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist joint = { data, joint_size, N };
    inform_dist as    = { data + joint_size, as_size, N };
    inform_dist bs    = { data + joint_size + as_size, bs_size, N };
    inform_dist s     = { data + joint_size + as_size + bs_size, s_size, N };

    accumulate_observations(src, dst, back, l_src, l_dst, l_back, n, m, b,
        &joint, &as, &bs, &s);

    double flow = 0.0;
    int bs_state, as_state, joint_state;
    double ns, nbs, nas, njoint;
    for (int s_state = 0; s_state < (int) s_size; ++s_state)
    {
        ns = s.histogram[s_state];
        if (ns == 0)
        {
            continue;
        }
        for (int b_state = 0; b_state < (int) b_size; ++b_state)
        {
            bs_state = b_state * s_size + s_state;
            nbs = bs.histogram[bs_state];
            if (nbs == 0)
            {
                continue;
            }
            for (int a_state = 0; a_state < (int) a_size; ++a_state)
            {
                as_state = a_state * s_size + s_state;
                nas = as.histogram[as_state];
                if (nas == 0)
                {
                    continue;
                }
                joint_state = a_state * bs_size + bs_state;
                njoint = joint.histogram[joint_state];
                if (njoint == 0)
                {
                    continue;
                }
                flow += njoint * log2((njoint * ns) / (nas * nbs));
            }
        }
    }

    free(data);

    return flow / N;
}